

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpWatchDog.c
# Opt level: O2

qpWatchDog *
qpWatchDog_create(qpWatchDogFunc timeOutFunc,void *userPtr,int totalTimeLimitSecs,
                 int intervalTimeLimitSecs)

{
  qpWatchDog *dog;
  deThread dVar1;
  
  dog = (qpWatchDog *)deCalloc(0x38);
  if (dog != (qpWatchDog *)0x0) {
    dog->timeOutFunc = timeOutFunc;
    dog->timeOutUserPtr = userPtr;
    dog->totalTimeLimit = totalTimeLimitSecs;
    dog->intervalTimeLimit = intervalTimeLimitSecs;
    qpWatchDog_reset(dog);
    dog->status = STATUS_THREAD_RUNNING;
    dVar1 = deThread_create(watchDogThreadFunc,dog,(deThreadAttributes *)0x0);
    dog->watchDogThread = dVar1;
    if (dVar1 != 0) {
      return dog;
    }
    deFree(dog);
  }
  return (qpWatchDog *)0x0;
}

Assistant:

qpWatchDog* qpWatchDog_create (qpWatchDogFunc timeOutFunc, void* userPtr, int totalTimeLimitSecs, int intervalTimeLimitSecs)
{
	/* Allocate & initialize. */
	qpWatchDog* dog = (qpWatchDog*)deCalloc(sizeof(qpWatchDog));
	if (!dog)
		return dog;

	DE_ASSERT(timeOutFunc);
	DE_ASSERT((totalTimeLimitSecs > 0) && (intervalTimeLimitSecs > 0));

	DBGPRINT(("qpWatchDog::create(%ds, %ds)\n", totalTimeLimitSecs, intervalTimeLimitSecs));

	dog->timeOutFunc		= timeOutFunc;
	dog->timeOutUserPtr		= userPtr;
	dog->totalTimeLimit		= totalTimeLimitSecs;
	dog->intervalTimeLimit	= intervalTimeLimitSecs;

	/* Reset (sets time values). */
	qpWatchDog_reset(dog);

	/* Initialize watchdog thread. */
	dog->status			= STATUS_THREAD_RUNNING;
	dog->watchDogThread = deThread_create(watchDogThreadFunc, dog, DE_NULL);
	if (!dog->watchDogThread)
	{
		deFree(dog);
		return DE_NULL;
	}

	return dog;
}